

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

void ma_device_uninit__pulse(ma_device *pDevice)

{
  ma_context *pmVar1;
  
  if (pDevice == (ma_device *)0x0) {
    __assert_fail("pDevice != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x4bf1,"void ma_device_uninit__pulse(ma_device *)");
  }
  pmVar1 = pDevice->pContext;
  if (pmVar1 != (ma_context *)0x0) {
    if ((pDevice->type & ~ma_device_type_playback) == ma_device_type_capture) {
      (*(pmVar1->field_21).alsa.snd_pcm_sw_params_sizeof)((pDevice->field_23).pulse.pStreamCapture);
      (*(pmVar1->field_21).alsa.snd_pcm_hw_params_get_periods)
                ((pDevice->field_23).pulse.pStreamCapture);
    }
    if ((pDevice->type | ma_device_type_capture) == ma_device_type_duplex) {
      (*(pmVar1->field_21).alsa.snd_pcm_sw_params_sizeof)((pDevice->field_23).pulse.pStreamPlayback)
      ;
      (*(pmVar1->field_21).alsa.snd_pcm_hw_params_get_periods)
                ((pDevice->field_23).pulse.pStreamPlayback);
    }
    (*(pmVar1->field_21).alsa.snd_pcm_hw_params_set_rate_resample)
              ((pDevice->field_23).pulse.pPulseContext);
    (*(pmVar1->field_21).alsa.snd_pcm_hw_params_get_format_mask)
              ((pDevice->field_23).pulse.pPulseContext);
    (*(pmVar1->field_21).alsa.snd_pcm_close)((pDevice->field_23).alsa.pPCMPlayback);
    return;
  }
  __assert_fail("pContext != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                ,0x4bf4,"void ma_device_uninit__pulse(ma_device *)");
}

Assistant:

static void ma_device_uninit__pulse(ma_device* pDevice)
{
    ma_context* pContext;

    MA_ASSERT(pDevice != NULL);

    pContext = pDevice->pContext;
    MA_ASSERT(pContext != NULL);

    if (pDevice->type == ma_device_type_capture || pDevice->type == ma_device_type_duplex) {
        ((ma_pa_stream_disconnect_proc)pContext->pulse.pa_stream_disconnect)((ma_pa_stream*)pDevice->pulse.pStreamCapture);
        ((ma_pa_stream_unref_proc)pContext->pulse.pa_stream_unref)((ma_pa_stream*)pDevice->pulse.pStreamCapture);
    }
    if (pDevice->type == ma_device_type_playback || pDevice->type == ma_device_type_duplex) {
        ((ma_pa_stream_disconnect_proc)pContext->pulse.pa_stream_disconnect)((ma_pa_stream*)pDevice->pulse.pStreamPlayback);
        ((ma_pa_stream_unref_proc)pContext->pulse.pa_stream_unref)((ma_pa_stream*)pDevice->pulse.pStreamPlayback);
    }

    ((ma_pa_context_disconnect_proc)pContext->pulse.pa_context_disconnect)((ma_pa_context*)pDevice->pulse.pPulseContext);
    ((ma_pa_context_unref_proc)pContext->pulse.pa_context_unref)((ma_pa_context*)pDevice->pulse.pPulseContext);
    ((ma_pa_mainloop_free_proc)pContext->pulse.pa_mainloop_free)((ma_pa_mainloop*)pDevice->pulse.pMainLoop);
}